

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void test_close_impl(char *file,int line,int sock)

{
  int iVar1;
  int *piVar2;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  iVar1 = nn_close(line,CONCAT44(in_register_00000034,line),CONCAT44(in_register_00000014,sock));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    if ((*piVar2 != 9) && (*piVar2 != 0x9523dfd)) {
      test_close_impl_cold_1();
    }
  }
  return;
}

Assistant:

static void NN_UNUSED test_close_impl (char *file, int line, int sock)
{
    int rc;

    rc = nn_close (sock);
    if ((rc != 0) && (errno != EBADF && errno != ETERM)) {
        fprintf (stderr, "Failed to close socket: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
}